

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

BPMNode * bpmnode_create(BPMLists *lists,int weight,uint index,BPMNode *tail)

{
  uint uVar1;
  BPMNode **ppBVar2;
  BPMNode **ppBVar3;
  ulong uVar4;
  BPMNode *pBVar5;
  long lVar6;
  ulong uVar7;
  
  if (lists->numfree <= lists->nextfree) {
    uVar4 = (ulong)lists->memsize;
    if (uVar4 != 0) {
      pBVar5 = lists->memory;
      lVar6 = 0;
      do {
        *(undefined4 *)((long)&pBVar5->in_use + lVar6) = 0;
        lVar6 = lVar6 + 0x18;
      } while (uVar4 * 0x18 != lVar6);
    }
    uVar1 = lists->listsize;
    if ((ulong)uVar1 != 0) {
      ppBVar2 = lists->chains0;
      ppBVar3 = lists->chains1;
      uVar7 = 0;
      do {
        for (pBVar5 = ppBVar2[uVar7]; pBVar5 != (BPMNode *)0x0; pBVar5 = pBVar5->tail) {
          pBVar5->in_use = 1;
        }
        for (pBVar5 = ppBVar3[uVar7]; pBVar5 != (BPMNode *)0x0; pBVar5 = pBVar5->tail) {
          pBVar5->in_use = 1;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar1);
    }
    lists->numfree = 0;
    if (uVar4 != 0) {
      lVar6 = 0;
      do {
        if (*(int *)((long)&lists->memory->in_use + lVar6) == 0) {
          uVar1 = lists->numfree;
          lists->numfree = uVar1 + 1;
          lists->freelist[uVar1] = (BPMNode *)((long)&lists->memory->weight + lVar6);
        }
        lVar6 = lVar6 + 0x18;
      } while (uVar4 * 0x18 != lVar6);
    }
    lists->nextfree = 0;
  }
  uVar1 = lists->nextfree;
  lists->nextfree = uVar1 + 1;
  pBVar5 = lists->freelist[uVar1];
  pBVar5->weight = weight;
  pBVar5->index = index;
  pBVar5->tail = tail;
  return pBVar5;
}

Assistant:

static BPMNode* bpmnode_create(BPMLists* lists, int weight, unsigned index, BPMNode* tail) {
  unsigned i;
  BPMNode* result;

  /*memory full, so garbage collect*/
  if(lists->nextfree >= lists->numfree) {
    /*mark only those that are in use*/
    for(i = 0; i != lists->memsize; ++i) lists->memory[i].in_use = 0;
    for(i = 0; i != lists->listsize; ++i) {
      BPMNode* node;
      for(node = lists->chains0[i]; node != 0; node = node->tail) node->in_use = 1;
      for(node = lists->chains1[i]; node != 0; node = node->tail) node->in_use = 1;
    }
    /*collect those that are free*/
    lists->numfree = 0;
    for(i = 0; i != lists->memsize; ++i) {
      if(!lists->memory[i].in_use) lists->freelist[lists->numfree++] = &lists->memory[i];
    }
    lists->nextfree = 0;
  }

  result = lists->freelist[lists->nextfree++];
  result->weight = weight;
  result->index = index;
  result->tail = tail;
  return result;
}